

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_cell_face_node(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_INT RVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  REF_INT face_nodes [4];
  REF_INT cell1;
  REF_INT tri_cell;
  REF_INT cell0;
  int local_68 [7];
  int local_4c;
  ulong local_48;
  REF_CELL local_40;
  REF_INT local_38;
  REF_INT local_34;
  
  ref_cell = ref_grid->cell[8];
  local_48 = 0xffffffff;
  if (-1 < node) {
    local_48 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      local_48 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)local_48 != -1) {
    RVar5 = ref_cell->ref_adj->item[(int)local_48].ref;
    ref_node = ref_grid->node;
    local_40 = ref_grid->cell[3];
    do {
      if (0 < ref_cell->face_per) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          pRVar2 = ref_cell->c2n;
          pRVar3 = ref_cell->f2n;
          lVar7 = 0;
          do {
            local_68[lVar7] =
                 pRVar2[(long)ref_cell->size_per * (long)RVar5 +
                        (long)*(int *)((long)pRVar3 + lVar7 * 4 + lVar8)];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          pRVar2 = ref_node->part;
          iVar1 = ref_node->ref_mpi->id;
          if ((((iVar1 == pRVar2[local_68[0]]) || (iVar1 == pRVar2[local_68[1]])) ||
              (iVar1 == pRVar2[local_68[2]])) || (iVar1 == pRVar2[local_68[3]])) {
            uVar6 = ref_cell_with_face(ref_cell,local_68,&local_34,&local_4c);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x102,"ref_validation_cell_face_node",(ulong)uVar6,"two expected");
              ref_node_location(ref_node,local_68[0]);
              ref_node_location(ref_node,local_68[1]);
              ref_node_location(ref_node,local_68[2]);
              ref_node_location(ref_node,local_68[3]);
              ref_validation_node_cell(ref_cell,local_68[0]);
              ref_validation_node_cell(ref_cell,local_68[1]);
              ref_validation_node_cell(ref_cell,local_68[2]);
              return uVar6;
            }
            if ((local_4c == -1) && (uVar6 = ref_cell_with(local_40,local_68,&local_38), uVar6 != 0)
               ) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x109,"ref_validation_cell_face_node",(ulong)uVar6,"matching tri");
              ref_node_location(ref_node,local_68[0]);
              ref_node_location(ref_node,local_68[1]);
              ref_node_location(ref_node,local_68[2]);
              ref_node_location(ref_node,local_68[3]);
              return uVar6;
            }
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x10;
        } while (lVar9 < ref_cell->face_per);
      }
      pRVar4 = ref_cell->ref_adj->item;
      iVar1 = pRVar4[(int)local_48].next;
      local_48 = (ulong)iVar1;
      if (local_48 == 0xffffffffffffffff) {
        RVar5 = -1;
      }
      else {
        RVar5 = pRVar4[local_48].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_face_node(REF_GRID ref_grid,
                                                 REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_face;
  REF_INT face_node, face_nodes[4];
  REF_INT cell0, cell1, tri_cell;

  each_ref_cell_having_node(tet, node, item, cell) {
    each_ref_cell_cell_face(tet, cell_face) {
      for (face_node = 0; face_node < 4; face_node++) {
        face_nodes[face_node] = ref_cell_f2n(tet, face_node, cell_face, cell);
      }
      if (ref_node_owned(ref_node, face_nodes[0]) ||
          ref_node_owned(ref_node, face_nodes[1]) ||
          ref_node_owned(ref_node, face_nodes[2]) ||
          ref_node_owned(ref_node, face_nodes[3])) {
        RSB(ref_cell_with_face(tet, face_nodes, &cell0, &cell1), "two expected",
            {
              ref_node_location(ref_node, face_nodes[0]);
              ref_node_location(ref_node, face_nodes[1]);
              ref_node_location(ref_node, face_nodes[2]);
              ref_node_location(ref_node, face_nodes[3]);
              ref_validation_node_cell(tet, face_nodes[0]);
              ref_validation_node_cell(tet, face_nodes[1]);
              ref_validation_node_cell(tet, face_nodes[2]);
            });
        if (REF_EMPTY == cell1) { /* should have tri on other side */
          RSB(ref_cell_with(tri, face_nodes, &tri_cell), "matching tri", {
            ref_node_location(ref_node, face_nodes[0]);
            ref_node_location(ref_node, face_nodes[1]);
            ref_node_location(ref_node, face_nodes[2]);
            ref_node_location(ref_node, face_nodes[3]);
          });
        }
      }
    }
  }

  return REF_SUCCESS;
}